

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::ProfilingModeSetting::SetLocal(ClientContext *context,Value *input)

{
  bool bVar1;
  ClientConfig *pCVar2;
  ParserException *this;
  __node_base _Var3;
  __node_base *p_Var4;
  string parameter;
  profiler_settings_t optimizer_settings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  profiler_settings_t phase_timing_settings;
  
  Value::ToString_abi_cxx11_((string *)&optimizer_settings,input);
  StringUtil::Lower((string *)&parameter,(string *)&optimizer_settings);
  ::std::__cxx11::string::~string((string *)&optimizer_settings);
  pCVar2 = ClientConfig::GetConfig(context);
  bVar1 = ::std::operator==(&parameter,"standard");
  if (bVar1) {
    pCVar2->enable_profiler = true;
    pCVar2->enable_detailed_profiling = false;
  }
  else {
    bVar1 = ::std::operator==(&parameter,"detailed");
    if (!bVar1) {
      this = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&optimizer_settings,
                 "Unrecognized profiling mode \"%s\", supported formats: [standard, detailed]",
                 (allocator *)&phase_timing_settings);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&parameter);
      ParserException::ParserException<std::__cxx11::string>
                (this,(string *)&optimizer_settings,&local_70);
      __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar2->enable_profiler = true;
    pCVar2->enable_detailed_profiling = true;
    MetricsUtils::GetOptimizerMetrics();
    for (_Var3 = optimizer_settings._M_h._M_before_begin; _Var3._M_nxt != (_Hash_node_base *)0x0;
        _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
      ::std::__detail::
      _Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pCVar2->profiler_settings,(value_type *)(_Var3._M_nxt + 1));
    }
    MetricsUtils::GetPhaseTimingMetrics();
    p_Var4 = &phase_timing_settings._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      ::std::__detail::
      _Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pCVar2->profiler_settings,(value_type *)(p_Var4 + 1));
    }
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&phase_timing_settings._M_h);
    ::std::
    _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&optimizer_settings._M_h);
  }
  ::std::__cxx11::string::~string((string *)&parameter);
  return;
}

Assistant:

void ProfilingModeSetting::SetLocal(ClientContext &context, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());
	auto &config = ClientConfig::GetConfig(context);
	if (parameter == "standard") {
		config.enable_profiler = true;
		config.enable_detailed_profiling = false;
	} else if (parameter == "detailed") {
		config.enable_profiler = true;
		config.enable_detailed_profiling = true;

		// add optimizer settings to the profiler settings
		auto optimizer_settings = MetricsUtils::GetOptimizerMetrics();
		for (auto &setting : optimizer_settings) {
			config.profiler_settings.insert(setting);
		}

		// add the phase timing settings to the profiler settings
		auto phase_timing_settings = MetricsUtils::GetPhaseTimingMetrics();
		for (auto &setting : phase_timing_settings) {
			config.profiler_settings.insert(setting);
		}
	} else {
		throw ParserException("Unrecognized profiling mode \"%s\", supported formats: [standard, detailed]", parameter);
	}
}